

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void __thiscall absl::substitute_internal::Arg::Arg(Arg *this,Dec dec)

{
  undefined1 auVar1 [16];
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  long __n;
  char *pcVar4;
  ulong in_RDX;
  ulong in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  bool add_sign_again;
  ptrdiff_t fillers;
  bool neg;
  uint64_t value;
  char *writer;
  char *minfill;
  char *end;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined7 in_stack_ffffffffffffffb0;
  byte bVar5;
  undefined7 in_stack_ffffffffffffffc0;
  ulong local_38;
  basic_string_view<char,_std::char_traits<char>_> *local_30;
  byte local_8;
  char cStack_7;
  undefined1 uStack_6;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI);
  local_8 = (byte)in_RDX;
  if (0x20 < local_8) {
    __assert_fail("dec.width <= numbers_internal::kFastToBufferSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/substitute.cc"
                  ,0x9a,"absl::substitute_internal::Arg::Arg(Dec)");
  }
  pbVar3 = in_RDI + 3;
  uStack_6 = (undefined1)(in_RDX >> 0x10);
  local_30 = pbVar3;
  for (local_38 = in_RSI; 9 < local_38; local_38 = local_38 / 10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_38;
    *(char *)((long)&local_30[-1]._M_str + 7) = SUB161(auVar1 % ZEXT816(10),0) + '0';
    local_30 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&local_30[-1]._M_str + 7);
  }
  *(char *)((long)&local_30[-1]._M_str + 7) = (char)local_38 + '0';
  pbVar2 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&local_30[-1]._M_str + 7);
  if ((in_RDX & 0x10000) != 0) {
    *(undefined1 *)((long)&local_30[-1]._M_str + 6) = 0x2d;
    pbVar2 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&local_30[-1]._M_str + 6);
  }
  local_30 = pbVar2;
  __n = (long)local_30 - ((long)pbVar3 - (long)(int)(uint)local_8);
  if (0 < __n) {
    bVar5 = 0;
    if (((in_RDX & 0x10000) != 0) && (cStack_7 = (char)(in_RDX >> 8), cStack_7 == '0')) {
      local_30 = (basic_string_view<char,_std::char_traits<char>_> *)((long)local_30 + 1);
      bVar5 = 1;
    }
    pcVar4 = (char *)((long)local_30 + -__n);
    std::fill_n<char*,long,char>
              ((char *)(CONCAT17(uStack_6,in_stack_ffffffffffffffc0) & 0x1ffffffffffffff),__n,
               (char *)CONCAT17(bVar5,in_stack_ffffffffffffffb0));
    local_30 = (basic_string_view<char,_std::char_traits<char>_> *)pcVar4;
    if ((bVar5 & 1) != 0) {
      local_30 = (basic_string_view<char,_std::char_traits<char>_> *)(pcVar4 + -1);
      pcVar4[-1] = '-';
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,(char *)local_30,(long)pbVar3 - (long)local_30);
  in_RDI->_M_len = local_60._M_len;
  in_RDI->_M_str = local_60._M_str;
  return;
}

Assistant:

Arg::Arg(Dec dec) {
  assert(dec.width <= numbers_internal::kFastToBufferSize);
  char* const end = &scratch_[numbers_internal::kFastToBufferSize];
  char* const minfill = end - dec.width;
  char* writer = end;
  uint64_t value = dec.value;
  bool neg = dec.neg;
  while (value > 9) {
    *--writer = '0' + (value % 10);
    value /= 10;
  }
  *--writer = '0' + static_cast<char>(value);
  if (neg) *--writer = '-';

  ptrdiff_t fillers = writer - minfill;
  if (fillers > 0) {
    // Tricky: if the fill character is ' ', then it's <fill><+/-><digits>
    // But...: if the fill character is '0', then it's <+/-><fill><digits>
    bool add_sign_again = false;
    if (neg && dec.fill == '0') {  // If filling with '0',
      ++writer;                    // ignore the sign we just added
      add_sign_again = true;       // and re-add the sign later.
    }
    writer -= fillers;
    std::fill_n(writer, fillers, dec.fill);
    if (add_sign_again) *--writer = '-';
  }

  piece_ = absl::string_view(writer, static_cast<size_t>(end - writer));
}